

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  gulps *pgVar1;
  gulps_print_output *this;
  pointer pgVar2;
  _func_bool_message_ptr *p_Var3;
  gulps_async_file_output *this_00;
  double __x;
  allocator local_181;
  string local_180 [32];
  message local_160;
  unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_> local_a0;
  __1 local_93;
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_> local_70;
  unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_> out2;
  __0 local_59;
  unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_> local_58;
  unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_> out;
  allocator local_39;
  string local_38 [32];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  local_18 = argv;
  argv_local._4_4_ = argc;
  pgVar1 = gulps::inst();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"TEST",&local_39);
  gulps::set_thread_tag(pgVar1,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this = (gulps_print_output *)operator_new(0x28);
  gulps::gulps_print_output::gulps_print_output(this,true,blue);
  std::unique_ptr<gulps::gulps_output,std::default_delete<gulps::gulps_output>>::
  unique_ptr<std::default_delete<gulps::gulps_output>,void>
            ((unique_ptr<gulps::gulps_output,std::default_delete<gulps::gulps_output>> *)&local_58,
             (pointer)this);
  pgVar2 = std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>::
           operator->(&local_58);
  p_Var3 = main::$_0::operator_cast_to_function_pointer(&local_59);
  gulps::gulps_output::add_filter(pgVar2,p_Var3);
  pgVar1 = gulps::inst();
  std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>::unique_ptr
            (&out2,&local_58);
  gulps::add_output(pgVar1,&out2);
  std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>::~unique_ptr
            (&out2);
  this_00 = (gulps_async_file_output *)operator_new(0x2f8);
  local_92 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"out.txt",&local_91);
  gulps::gulps_async_file_output::gulps_async_file_output(this_00,(string *)local_90);
  local_92 = 0;
  std::unique_ptr<gulps::gulps_output,std::default_delete<gulps::gulps_output>>::
  unique_ptr<std::default_delete<gulps::gulps_output>,void>
            ((unique_ptr<gulps::gulps_output,std::default_delete<gulps::gulps_output>> *)&local_70,
             (pointer)this_00);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pgVar2 = std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>::
           operator->(&local_70);
  p_Var3 = main::$_1::operator_cast_to_function_pointer(&local_93);
  gulps::gulps_output::add_filter(pgVar2,p_Var3);
  pgVar1 = gulps::inst();
  std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>::unique_ptr
            (&local_a0,&local_70);
  gulps::add_output(pgVar1,&local_a0);
  std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>::~unique_ptr
            (&local_a0);
  pgVar1 = gulps::inst();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"test-out",&local_181);
  gulps::message::message
            (&local_160,LEVEL_OUTPUT_0,"ab","abc",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/main.cpp",
             0x189,(string *)local_180,red);
  gulps::log(pgVar1,__x);
  gulps::message::~message(&local_160);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>::~unique_ptr
            (&local_70);
  std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>::~unique_ptr
            (&local_58);
  return 0;
}

Assistant:

int main(int argc, char **argv) 
{
	gulps::inst().set_thread_tag("TEST");
	std::unique_ptr<gulps::gulps_output> out(new gulps::gulps_print_output(true, fmt::color::blue));
	out->add_filter([](const gulps::message& msg) -> bool { return true; });
	gulps::inst().add_output(std::move(out));

	std::unique_ptr<gulps::gulps_output> out2(new gulps::gulps_async_file_output("out.txt"));
	out2->add_filter([](const gulps::message& msg) -> bool { return true; });
	gulps::inst().add_output(std::move(out2));
	
	gulps::inst().log(gulps::message(gulps::LEVEL_OUTPUT_0, "ab", "abc", __FILE__, __LINE__, "test-out", fmt::color::red));
}